

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O0

bool __thiscall UnifiedRegex::OctoquadIdentifier::AppendChar(OctoquadIdentifier *this,Char c)

{
  int iVar1;
  int iVar2;
  int code;
  Char c_local;
  OctoquadIdentifier *this_local;
  
  if (((this->currPatternLength < 8) && (-1 < this->currPatternNum)) && (this->currPatternNum < 2))
  {
    iVar2 = GetOrAddCharCode(this,c);
    if (iVar2 < 0) {
      this_local._7_1_ = false;
    }
    else {
      iVar1 = this->currPatternLength;
      this->currPatternLength = iVar1 + 1;
      this->patternBits[this->currPatternNum][iVar1] = (char)(1 << ((byte)iVar2 & 0x1f));
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool OctoquadIdentifier::AppendChar(Char c)
    {
        if (currPatternLength >= TrigramInfo::PatternLength || currPatternNum < 0 || currPatternNum >= NumPatterns)
            return false;
        int code = GetOrAddCharCode(c);
        if (code < 0)
            return false;
        patternBits[currPatternNum][currPatternLength++] = 1 << code;
        return true;
    }